

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int breplace(bstring b1,int pos,int len,bstring b2,uchar fill)

{
  int iVar1;
  long lVar2;
  bstring local_48;
  bstring aux;
  ptrdiff_t pd;
  int ret;
  int pl;
  uchar fill_local;
  bstring b2_local;
  int len_local;
  int pos_local;
  bstring b1_local;
  
  if ((((((pos < 0) || (len < 0)) || (pos + len < 0)) ||
       ((b1 == (bstring)0x0 || (b2 == (bstring)0x0)))) ||
      ((b1->data == (uchar *)0x0 || ((b2->data == (uchar *)0x0 || (b1->slen < 0)))))) ||
     ((b2->slen < 0 || ((b1->mlen < b1->slen || (b1->mlen < 1)))))) {
    b1_local._4_4_ = -1;
  }
  else if (pos + len < b1->slen) {
    lVar2 = (long)b2->data - (long)b1->data;
    local_48 = b2;
    if (((lVar2 < 0) || (b1->slen <= lVar2)) || (local_48 = bstrcpy(b2), local_48 != (bstring)0x0))
    {
      if ((len < local_48->slen) &&
         (iVar1 = balloc(b1,(b1->slen + local_48->slen) - len), iVar1 != 0)) {
        if (local_48 != b2) {
          bdestroy(local_48);
        }
        b1_local._4_4_ = -1;
      }
      else {
        if (local_48->slen != len) {
          memmove(b1->data + (long)local_48->slen + (long)pos,b1->data + (long)len + (long)pos,
                  (long)(b1->slen - (pos + len)));
        }
        memcpy(b1->data + pos,local_48->data,(long)local_48->slen);
        b1->slen = (local_48->slen - len) + b1->slen;
        b1->data[b1->slen] = '\0';
        if (local_48 != b2) {
          bdestroy(local_48);
        }
        b1_local._4_4_ = 0;
      }
    }
    else {
      b1_local._4_4_ = -1;
    }
  }
  else {
    b1_local._4_4_ = bsetstr(b1,pos,b2,fill);
    if ((-1 < b1_local._4_4_) && (pos + b2->slen < b1->slen)) {
      b1->slen = pos + b2->slen;
      b1->data[b1->slen] = '\0';
    }
  }
  return b1_local._4_4_;
}

Assistant:

int breplace (bstring b1, int pos, int len, const bstring b2, 
			  unsigned char fill) {
int pl, ret;
ptrdiff_t pd;
bstring aux = b2;

	if (pos < 0 || len < 0 || (pl = pos + len) < 0 || b1 == NULL || 
	    b2 == NULL || b1->data == NULL || b2->data == NULL || 
	    b1->slen < 0 || b2->slen < 0 || b1->mlen < b1->slen ||
	    b1->mlen <= 0) return BSTR_ERR;

	/* Straddles the end? */
	if (pl >= b1->slen) {
		if ((ret = bsetstr (b1, pos, b2, fill)) < 0) return ret;
		if (pos + b2->slen < b1->slen) {
			b1->slen = pos + b2->slen;
			b1->data[b1->slen] = (unsigned char) '\0';
		}
		return ret;
	}

	/* Aliasing case */
	if ((pd = (ptrdiff_t) (b2->data - b1->data)) >= 0 && pd < (ptrdiff_t) b1->slen) {
		if (NULL == (aux = bstrcpy (b2))) return BSTR_ERR;
	}

	if (aux->slen > len) {
		if (balloc (b1, b1->slen + aux->slen - len) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
	}

	if (aux->slen != len) bstr__memmove (b1->data + pos + aux->slen, b1->data + pos + len, b1->slen - (pos + len));
	bstr__memcpy (b1->data + pos, aux->data, aux->slen);
	b1->slen += aux->slen - len;
	b1->data[b1->slen] = (unsigned char) '\0';
	if (aux != b2) bdestroy (aux);
	return BSTR_OK;
}